

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int testobjref(global_State *g,GCObject *f,GCObject *t)

{
  int iVar1;
  int r1;
  GCObject *t_local;
  GCObject *f_local;
  global_State *g_local;
  
  iVar1 = testobjref1(g,f,t);
  if (iVar1 == 0) {
    printf("%d(%02X) - ",(ulong)g->gcstate,(ulong)g->currentwhite);
    printobj(g,f);
    printf("  ->  ");
    printobj(g,t);
    printf(anon_var_dwarf_b51f + 5);
  }
  return iVar1;
}

Assistant:

static int testobjref (global_State *g, GCObject *f, GCObject *t) {
  int r1 = testobjref1(g, f, t);
  if (!r1) {
    printf("%d(%02X) - ", g->gcstate, g->currentwhite);
    printobj(g, f);
    printf("  ->  ");
    printobj(g, t);
    printf("\n");
  }
  return r1;
}